

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenscanner.cpp
# Opt level: O3

void __thiscall TokenScanner::setInput(TokenScanner *this,string *str)

{
  istringstream *this_00;
  
  this->stringInputFlag = true;
  std::__cxx11::string::_M_assign((string *)&this->buffer);
  this_00 = (istringstream *)operator_new(0x180);
  std::__cxx11::istringstream::istringstream(this_00,(string *)&this->buffer,_S_in);
  this->isp = (istream *)this_00;
  this->savedTokens = (StringCell *)0x0;
  return;
}

Assistant:

void TokenScanner::setInput(string str) {
   stringInputFlag = true;
   buffer = str;
   isp = new istringstream(buffer);
   savedTokens = NULL;
}